

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

string * __thiscall
front::syntax::SyntaxAnalyze::hp_gen_save_value_abi_cxx11_
          (string *__return_storage_ptr__,SyntaxAnalyze *this)

{
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"$$",(allocator<char> *)&local_38);
  std::operator+(&local_78,__return_storage_ptr__,"__Compiler__gen__save__value__");
  std::__cxx11::to_string(&sStack_98,this->_genValueNum);
  std::operator+(&local_58,&local_78,&sStack_98);
  std::operator+(&local_38,&local_58,"__$$");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  this->_genValueNum = this->_genValueNum + 1;
  return __return_storage_ptr__;
}

Assistant:

string SyntaxAnalyze::hp_gen_save_value() {
  string name = "$$";
  name = name + "__Compiler__gen__save__value__" + to_string(_genValueNum) +
         "__$$";
  _genValueNum++;
  return name;
}